

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option-parser.cc
# Opt level: O0

void __thiscall wabt::OptionParser::AddHelpOption(OptionParser *this)

{
  anon_class_8_1_8991fb9c local_38;
  NullCallback local_30;
  OptionParser *local_10;
  OptionParser *this_local;
  
  local_38.this = this;
  local_10 = this;
  std::function<void()>::function<wabt::OptionParser::AddHelpOption()::__0,void>
            ((function<void()> *)&local_30,&local_38);
  AddOption(this,"help","Print this help message",&local_30);
  std::function<void_()>::~function(&local_30);
  return;
}

Assistant:

void OptionParser::AddHelpOption() {
  AddOption("help", "Print this help message", [this]() {
    PrintHelp();
    exit(0);
  });
}